

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * HelpExampleRpc(string *methodname,string *args)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::operator+(in_stack_ffffffffffffff98,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpExampleRpc(const std::string& methodname, const std::string& args)
{
    return "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", "
        "\"method\": \"" + methodname + "\", \"params\": [" + args + "]}' -H 'content-type: application/json' http://127.0.0.1:8332/\n";
}